

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_field.cc
# Opt level: O2

void google::protobuf::compiler::cpp::SetCommonFieldVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Options *options)

{
  int field_number;
  bool bVar1;
  Type type;
  FieldType type_00;
  mapped_type *pmVar2;
  char *pcVar3;
  Descriptor *this;
  size_t u64;
  Options *in_RCX;
  int __c;
  FieldDescriptor *field;
  AlphaNum *a;
  AlphaNum *a_00;
  Descriptor *descriptor_00;
  FieldDescriptor *field_00;
  AlphaNum *a_01;
  FieldDescriptor *field_01;
  AlphaNum *pAVar4;
  key_type local_c0;
  allocator local_99;
  AlphaNum local_98;
  undefined1 local_68 [64];
  
  SetCommonVars(options,variables);
  Namespace_abi_cxx11_((string *)&local_98,(cpp *)descriptor,(FieldDescriptor *)options,in_RCX);
  std::__cxx11::string::string((string *)&local_c0,"ns",(allocator *)local_68);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_98);
  FieldName_abi_cxx11_((string *)&local_98,(cpp *)descriptor,field);
  std::__cxx11::string::string((string *)&local_c0,"name",(allocator *)local_68);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c0);
  pAVar4 = &local_98;
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_98);
  pcVar3 = FieldDescriptor::index(descriptor,(char *)pAVar4,__c);
  strings::AlphaNum::AlphaNum(&local_98,(int)pcVar3);
  StrCat_abi_cxx11_(&local_c0,(protobuf *)&local_98,a);
  std::__cxx11::string::string((string *)local_68,"index",(allocator *)(local_68 + 0x20));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_68);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_c0);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)&local_c0);
  strings::AlphaNum::AlphaNum(&local_98,*(int *)(descriptor + 4));
  StrCat_abi_cxx11_(&local_c0,(protobuf *)&local_98,a_00);
  std::__cxx11::string::string((string *)local_68,"number",(allocator *)(local_68 + 0x20));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_68);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_c0);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)&local_c0);
  this = FieldScope(descriptor);
  ClassName_abi_cxx11_((string *)&local_98,(cpp *)this,descriptor_00);
  std::__cxx11::string::string((string *)&local_c0,"classname",(allocator *)local_68);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_98);
  type = FieldDescriptor::type(descriptor);
  DeclaredTypeMethodName(type);
  std::__cxx11::string::string((string *)&local_98,"declared_type",(allocator *)&local_c0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_98);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_98);
  FieldName_abi_cxx11_(&local_c0,(cpp *)descriptor,field_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                 &local_c0,"_");
  std::__cxx11::string::string((string *)local_68,"field_member",(allocator *)(local_68 + 0x20));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_68);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_98);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_c0);
  field_number = *(int *)(descriptor + 4);
  type_00 = FieldDescriptor::type(descriptor);
  u64 = internal::WireFormatLite::TagSize(field_number,type_00);
  strings::AlphaNum::AlphaNum(&local_98,u64);
  StrCat_abi_cxx11_(&local_c0,(protobuf *)&local_98,a_01);
  std::__cxx11::string::string((string *)local_68,"tag_size",(allocator *)(local_68 + 0x20));
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)local_68);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_c0);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)&local_c0);
  DeprecatedAttribute_abi_cxx11_
            ((string *)&local_98,(cpp *)options,(Options *)descriptor,(FieldDescriptor *)in_RCX);
  std::__cxx11::string::string((string *)&local_c0,"deprecated_attr",(allocator *)local_68);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_98);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"set_hasbit",(allocator *)&local_c0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_98);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"clear_hasbit",(allocator *)&local_c0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_98);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = HasHasbit(descriptor);
  if (bVar1) {
    FieldName_abi_cxx11_((string *)local_68,(cpp *)descriptor,field_01);
    std::operator+(&local_c0,"_Internal::set_has_",(string *)local_68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                   &local_c0,"(&_has_bits_);");
    std::__cxx11::string::string((string *)(local_68 + 0x20),"set_hasbit_io",&local_99);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)(local_68 + 0x20));
    std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_98);
    std::__cxx11::string::~string((string *)(local_68 + 0x20));
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_c0);
    pAVar4 = (AlphaNum *)local_68;
  }
  else {
    std::__cxx11::string::string((string *)&local_98,"set_hasbit_io",(allocator *)&local_c0);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](variables,(key_type *)&local_98);
    std::__cxx11::string::assign((char *)pmVar2);
    pAVar4 = &local_98;
  }
  std::__cxx11::string::~string((string *)pAVar4);
  AddAccessorAnnotations(descriptor,options,variables);
  std::__cxx11::string::string((string *)&local_98,"{",(allocator *)&local_c0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_98);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string((string *)&local_98,"}",(allocator *)&local_c0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,(key_type *)&local_98);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void SetCommonFieldVariables(const FieldDescriptor* descriptor,
                             std::map<std::string, std::string>* variables,
                             const Options& options) {
  SetCommonVars(options, variables);
  (*variables)["ns"] = Namespace(descriptor, options);
  (*variables)["name"] = FieldName(descriptor);
  (*variables)["index"] = StrCat(descriptor->index());
  (*variables)["number"] = StrCat(descriptor->number());
  (*variables)["classname"] = ClassName(FieldScope(descriptor), false);
  (*variables)["declared_type"] = DeclaredTypeMethodName(descriptor->type());
  (*variables)["field_member"] = FieldName(descriptor) + "_";

  (*variables)["tag_size"] = StrCat(
      WireFormat::TagSize(descriptor->number(), descriptor->type()));
  (*variables)["deprecated_attr"] = DeprecatedAttribute(options, descriptor);

  (*variables)["set_hasbit"] = "";
  (*variables)["clear_hasbit"] = "";
  if (HasHasbit(descriptor)) {
    (*variables)["set_hasbit_io"] =
        "_Internal::set_has_" + FieldName(descriptor) + "(&_has_bits_);";
  } else {
    (*variables)["set_hasbit_io"] = "";
  }

  AddAccessorAnnotations(descriptor, options, variables);

  // These variables are placeholders to pick out the beginning and ends of
  // identifiers for annotations (when doing so with existing variables would
  // be ambiguous or impossible). They should never be set to anything but the
  // empty string.
  (*variables)["{"] = "";
  (*variables)["}"] = "";
}